

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v3::load_kinematics(xr_ogf_v3 *this,xr_reader *r)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  xr_ogf_vec *pxVar5;
  xr_vbuf *pxVar6;
  const_reference ppxVar7;
  undefined4 extraout_var;
  finfluence *pfVar8;
  fvector3 *pfVar9;
  _vector3<float> *v;
  xr_bone_vec *this_00;
  reference ppxVar10;
  undefined1 local_64 [8];
  fvector3 temp;
  fmatrix *xform;
  fvector3 *pv;
  int bone;
  finfluence *weights;
  size_t i;
  xr_vbuf *vb;
  size_t j;
  xr_reader *s;
  xr_reader *r_local;
  xr_ogf_v3 *this_local;
  
  s = r;
  r_local = (xr_reader *)this;
  load_hierrarhy_visual(this,r);
  j = (size_t)xr_reader::open_chunk(s,0x18);
  if ((xr_reader *)j != (xr_reader *)0x0) {
    load_s_userdata(this,(xr_reader *)j);
    bVar2 = xr_reader::eof((xr_reader *)j);
    if (!bVar2) {
      __assert_fail("s->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                    ,0x372,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
    }
    xr_reader::close_chunk(s,(xr_reader **)&j);
  }
  sVar4 = xr_reader::find_chunk(s,0xd);
  if (sVar4 != 0) {
    load_s_bone_names(this,s);
    xr_reader::debug_find_chunk(s);
    j = (size_t)xr_reader::open_chunk(s,0x1c);
    if ((xr_reader *)j == (xr_reader *)0x0) {
      j = (size_t)xr_reader::open_chunk(s,0x19);
      if ((xr_reader *)j == (xr_reader *)0x0) {
        j = (size_t)xr_reader::open_chunk(s,0x17);
        if ((xr_reader *)j != (xr_reader *)0x0) {
          load_s_ikdata_0(this,(xr_reader *)j);
          bVar2 = xr_reader::eof((xr_reader *)j);
          if (!bVar2) {
            __assert_fail("s->eof()",
                          "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                          ,0x38a,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
          }
          xr_reader::close_chunk(s,(xr_reader **)&j);
        }
      }
      else {
        load_s_ikdata(this,(xr_reader *)j);
        bVar2 = xr_reader::eof((xr_reader *)j);
        if (!bVar2) {
          __assert_fail("s->eof()",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                        ,900,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
        }
        xr_reader::close_chunk(s,(xr_reader **)&j);
      }
    }
    else {
      load_s_ikdata_2(this,(xr_reader *)j);
      bVar2 = xr_reader::eof((xr_reader *)j);
      if (!bVar2) {
        __assert_fail("s->eof()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                      ,0x37e,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
      }
      xr_reader::close_chunk(s,(xr_reader **)&j);
    }
    xr_object::calculate_bind((xr_object *)this);
    vb = (xr_vbuf *)0x0;
    while( true ) {
      pxVar5 = xr_ogf::children(&this->super_xr_ogf);
      pxVar6 = (xr_vbuf *)
               std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::size(pxVar5);
      if (vb == pxVar6) break;
      pxVar5 = xr_ogf::children(&this->super_xr_ogf);
      ppxVar7 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::operator[]
                          (pxVar5,(size_type)vb);
      iVar3 = (*((*ppxVar7)->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                [0x1f])();
      pxVar6 = (xr_vbuf *)CONCAT44(extraout_var,iVar3);
      for (weights = (finfluence *)0x0;
          pfVar8 = (finfluence *)xr_flexbuf::size((xr_flexbuf *)pxVar6), weights != pfVar8;
          weights = (finfluence *)
                    ((long)&(weights->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>
                            ).array[0].bone + 1)) {
        pfVar8 = xr_vbuf::w(pxVar6);
        uVar1 = pfVar8[(long)weights].super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>
                .array[0].bone;
        pfVar9 = xr_vbuf::p(pxVar6);
        v = pfVar9 + (long)weights;
        this_00 = xr_object::bones((xr_object *)this);
        ppxVar10 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::operator[]
                             (this_00,(long)(int)uVar1);
        temp.field_0._4_8_ = xr_bone::bind_xform(*ppxVar10);
        _vector3<float>::transform
                  ((_vector3<float> *)local_64,v,(_matrix<float> *)temp.field_0._4_8_);
        *(undefined1 (*) [8])&v->field_0 = local_64;
        (v->field_0).field_0.z = temp.field_0.field_0.x;
      }
      vb = (xr_vbuf *)((long)&(vb->super_xr_flexbuf)._vptr_xr_flexbuf + 1);
    }
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                ,0x377,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
}

Assistant:

void xr_ogf_v3::load_kinematics(xr_reader& r)
{
	load_hierrarhy_visual(r);

	xr_reader* s = r.open_chunk(OGF3_S_USERDATA);
	if (s) {
		load_s_userdata(*s);
		assert(s->eof());
		r.close_chunk(s);
	}

	if (!r.find_chunk(OGF3_S_BONE_NAMES))
		xr_not_expected();
	load_s_bone_names(r);
	r.debug_find_chunk();

	s = r.open_chunk(OGF3_S_IKDATA_2);
	if (s) {
		load_s_ikdata_2(*s);
		xr_assert(s->eof());
		r.close_chunk(s);
	} else {
		s = r.open_chunk(OGF3_S_IKDATA);
		if (s) {
			load_s_ikdata(*s);
			xr_assert(s->eof());
			r.close_chunk(s);
		} else {
			s = r.open_chunk(OGF3_S_IKDATA_0);
			if (s) {
				load_s_ikdata_0(*s);
				xr_assert(s->eof());
				r.close_chunk(s);
			}
		}
	}

	//��������� ���������� ������ �� ������� ������������ ����� � ������� ������������ ������
	//������ ������� ������ ��� ��������
	calculate_bind();
	for(size_t j = 0; j!= children().size(); ++j)
	{
		const xr_vbuf & vb = children()[j]->vb();
		for (size_t i = 0; i != vb.size(); ++i)
		{
			const finfluence * weights =  vb.w() + i;
			int bone = weights->array[0].bone;
			fvector3 * pv = const_cast<fvector3 *>(vb.p() + i);
			const fmatrix& xform = bones()[bone]->bind_xform(); 
			fvector3 temp;
			temp.transform(*pv, xform);
			*pv = temp;
		}
	}
}